

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirINCBIN(void)

{
  bool bVar1;
  int iVar2;
  aint local_1c;
  fullpath_ref_t pSStack_18;
  aint val;
  fullpath_ref_t fnaam;
  int length;
  int offset;
  
  fnaam._4_4_ = 0;
  fnaam._0_4_ = 0x7fffffff;
  pSStack_18 = GetInputFile(&lp);
  bVar1 = anyComma(&lp);
  if (bVar1) {
    bVar1 = anyComma(&lp);
    if (bVar1) {
      lp = lp + -1;
    }
    else {
      iVar2 = ParseExpressionNoSyntaxError(&lp,&local_1c);
      if (iVar2 == 0) {
        Error("[INCBIN] Syntax error in <offset>",bp,SUPPRESS);
        return;
      }
      fnaam._4_4_ = local_1c;
    }
    bVar1 = anyComma(&lp);
    if (bVar1) {
      iVar2 = ParseExpressionNoSyntaxError(&lp,&local_1c);
      if (iVar2 == 0) {
        Error("[INCBIN] Syntax error in <length>",bp,SUPPRESS);
        return;
      }
      fnaam._0_4_ = local_1c;
    }
  }
  BinIncFile(pSStack_18,fnaam._4_4_,(aint)fnaam);
  return;
}

Assistant:

static void dirINCBIN() {
	int offset = 0, length = INT_MAX;
	fullpath_ref_t fnaam = GetInputFile(lp);
	if (anyComma(lp)) {
		aint val;
		if (!anyComma(lp)) {
			if (!ParseExpressionNoSyntaxError(lp, val)) {
				Error("[INCBIN] Syntax error in <offset>", bp, SUPPRESS);
				return;
			}
			offset = val;
		} else --lp;		// there was second comma right after, reread it
		if (anyComma(lp)) {
			if (!ParseExpressionNoSyntaxError(lp, val)) {
				Error("[INCBIN] Syntax error in <length>", bp, SUPPRESS);
				return;
			}
			length = val;
		}
	}
	BinIncFile(fnaam, offset, length);
}